

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O1

void msgpack::v1::StdTupleConverter<std::tuple<int,_empty_obj>_&,_2UL>::convert
               (object *o,tuple<int,_empty_obj> *v)

{
  object *poVar1;
  object_kv *poVar2;
  int iVar3;
  object v_1;
  define_array<> local_29;
  object local_28;
  
  if ((o->super_object).via.array.size != 0) {
    poVar1 = (o->super_object).via.array.ptr;
    local_28.via.array.ptr = (poVar1->super_object).via.array.ptr;
    local_28.type = (poVar1->super_object).type;
    local_28._4_4_ = *(undefined4 *)&(poVar1->super_object).field_0x4;
    local_28.via.u64 = (poVar1->super_object).via.u64;
    iVar3 = type::detail::convert_integer_sign<int,_true>::convert((object *)&local_28);
    (v->super__Tuple_impl<0UL,_int,_empty_obj>).super__Head_base<0UL,_int,_false>._M_head_impl =
         iVar3;
  }
  if (1 < (o->super_object).via.array.size) {
    poVar2 = (o->super_object).via.map.ptr;
    local_28.via.array.ptr = (poVar2->val).super_object.via.array.ptr;
    local_28.type = (poVar2->val).super_object.type;
    local_28._4_4_ = *(undefined4 *)&(poVar2->val).super_object.field_0x4;
    local_28.via.u64 = (poVar2->val).super_object.via.u64;
    type::define_array<>::msgpack_unpack(&local_29,(object *)&local_28);
  }
  return;
}

Assistant:

static void convert(
        msgpack::object const& o,
        Tuple& v) {
        StdTupleConverter<Tuple, N-1>::convert(o, v);
        if (o.via.array.size >= N)
            o.via.array.ptr[N-1].convert<typename std::remove_reference<decltype(std::get<N-1>(v))>::type>(std::get<N-1>(v));
    }